

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Vector3 * __thiscall
stateObservation::kine::Orientation::operator*
          (Vector3 *__return_storage_ptr__,Orientation *this,Vector3 *v)

{
  Matrix<double,_3,_3,_0,_3,_3> *local_28;
  Vector3 *local_20;
  
  check_(this);
  if ((this->m_).isSet_.b_ == false) {
    quaternionToMatrix_(this);
  }
  CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
            (&this->m_);
  local_28 = &(this->m_).v_;
  local_20 = v;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Orientation::operator*(const Vector3 & v) const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_() * v;
}